

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

bool __thiscall
MemoryManager::setShort(MemoryManager *this,uint32_t addr,uint16_t val,uint32_t *cycles)

{
  bool bVar1;
  uint32_t *in_RCX;
  undefined2 in_DX;
  uint in_ESI;
  MemoryManager *in_RDI;
  undefined2 in_stack_fffffffffffffff0;
  uint8_t val_00;
  
  val_00 = (uint8_t)((ushort)in_DX >> 8);
  bVar1 = addrExist((MemoryManager *)
                    CONCAT44(in_ESI,CONCAT13(val_00,CONCAT12((char)in_DX,in_stack_fffffffffffffff0))
                            ),(uint32_t)((ulong)in_RCX >> 0x20));
  if (!bVar1) {
    printf("Memory write to invalid addr 0x%x!\n",(ulong)in_ESI);
    exit(-1);
  }
  setByte(in_RDI,in_ESI,val_00,in_RCX);
  setByte(in_RDI,in_ESI,val_00,in_RCX);
  return true;
}

Assistant:

bool MemoryManager::setShort(uint32_t addr, uint16_t val, uint32_t *cycles) {
//    return setNByte(addr, 2, &val, cycles);
    if (!this->addrExist(addr)) {
        printf("Memory write to invalid addr 0x%x!\n", addr);
        exit(-1);
    }
    this->setByte(addr, val & 0xff, cycles);
    this->setByte(addr + 1, (val >> 8u) & 0xff);
    return true;
}